

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

bool __thiscall Json::StyledWriter::isMultineArray(StyledWriter *this,Value *value)

{
  bool bVar1;
  ArrayIndex AVar2;
  ArrayIndex AVar3;
  int iVar4;
  Value *pVVar5;
  bool local_46;
  bool local_45;
  byte local_44;
  bool local_43;
  bool local_42;
  byte local_41;
  int local_38;
  int local_34;
  int index_1;
  int lineLength;
  Value *childValue;
  bool local_1d;
  int index;
  bool isMultiLine;
  int size;
  Value *value_local;
  StyledWriter *this_local;
  
  AVar2 = Value::size(value);
  local_1d = this->rightMargin_ <= (int)(AVar2 * 3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->childValues_);
  childValue._4_4_ = 0;
  do {
    local_41 = 0;
    if (childValue._4_4_ < (int)AVar2) {
      local_41 = local_1d ^ 0xff;
    }
    if ((local_41 & 1) == 0) {
      if (local_1d == false) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve(&this->childValues_,(long)(int)AVar2);
        this->addChildValues_ = true;
        local_34 = (AVar2 - 1) * 2 + 4;
        local_38 = 0;
        while( true ) {
          local_44 = 0;
          if (local_38 < (int)AVar2) {
            local_44 = local_1d ^ 0xff;
          }
          if ((local_44 & 1) == 0) break;
          pVVar5 = Value::operator[](value,local_38);
          writeValue(this,pVVar5);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&this->childValues_,(long)local_38);
          iVar4 = std::__cxx11::string::length();
          local_34 = iVar4 + local_34;
          local_45 = false;
          if (local_1d != false) {
            pVVar5 = Value::operator[](value,local_38);
            local_45 = hasCommentForValue(this,pVVar5);
          }
          local_1d = local_45;
          local_38 = local_38 + 1;
        }
        this->addChildValues_ = false;
        local_46 = true;
        if (local_1d == false) {
          local_46 = this->rightMargin_ <= local_34;
        }
        local_1d = local_46;
      }
      return local_1d;
    }
    pVVar5 = Value::operator[](value,childValue._4_4_);
    local_42 = true;
    if (local_1d == false) {
      bVar1 = Value::isArray(pVVar5);
      if (bVar1) {
LAB_0026b034:
        AVar3 = Value::size(pVVar5);
        local_43 = AVar3 != 0;
      }
      else {
        bVar1 = Value::isObject(pVVar5);
        local_43 = false;
        if (bVar1) goto LAB_0026b034;
      }
      local_42 = local_43;
    }
    local_1d = local_42;
    childValue._4_4_ = childValue._4_4_ + 1;
  } while( true );
}

Assistant:

bool 
StyledWriter::isMultineArray( const Value &value )
{
   int size = value.size();
   bool isMultiLine = size*3 >= rightMargin_ ;
   childValues_.clear();
   for ( int index =0; index < size  &&  !isMultiLine; ++index )
   {
      const Value &childValue = value[index];
      isMultiLine = isMultiLine  ||
                     ( (childValue.isArray()  ||  childValue.isObject())  &&  
                        childValue.size() > 0 );
   }
   if ( !isMultiLine ) // check if line length > max line length
   {
      childValues_.reserve( size );
      addChildValues_ = true;
      int lineLength = 4 + (size-1)*2; // '[ ' + ', '*n + ' ]'
      for ( int index =0; index < size  &&  !isMultiLine; ++index )
      {
         writeValue( value[index] );
         lineLength += int( childValues_[index].length() );
         isMultiLine = isMultiLine  &&  hasCommentForValue( value[index] );
      }
      addChildValues_ = false;
      isMultiLine = isMultiLine  ||  lineLength >= rightMargin_;
   }
   return isMultiLine;
}